

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

Error asmjit::v1_14::JitAllocatorImpl_shrink
                (JitAllocatorPrivateImpl *impl,Span *span,size_t newSize,bool alreadyUnderWriteScope
                )

{
  byte bVar1;
  ushort uVar2;
  JitAllocatorBlock *this;
  JitAllocatorPool *pJVar3;
  uint32_t shrunkAreaEnd;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  void *mem;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  Error EVar10;
  ProtectJitReadWriteScope scope;
  
  this = (JitAllocatorBlock *)span->_block;
  if (this == (JitAllocatorBlock *)0x0) {
    EVar10 = 2;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&impl->lock);
    pJVar3 = this->_pool;
    bVar1 = pJVar3->granularityLog2;
    uVar9 = (ulong)((long)span->_rx - (long)(this->_mapping).rx) >> (bVar1 & 0x3f);
    iVar8 = (int)uVar9;
    if ((this->_usedBitVector[uVar9 >> 6 & 0x3ffffff] >> (uVar9 & 0x3f) & 1) == 0) {
      EVar10 = 2;
    }
    else {
      sVar4 = Support::bitVectorIndexOf<unsigned_long>
                        (this->_stopBitVector,uVar9 & 0xffffffff,SUB81(pJVar3,0));
      shrunkAreaEnd = (int)sVar4 + 1;
      uVar7 = shrunkAreaEnd - iVar8;
      uVar2 = pJVar3->granularity;
      uVar5 = (uint)uVar2;
      uVar9 = (newSize + uVar2) - 1 >> (bVar1 & 0x3f);
      uVar6 = (uint)uVar9;
      EVar10 = 2;
      if (uVar6 <= uVar7) {
        if (uVar7 - uVar6 != 0) {
          JitAllocatorBlock::markShrunkArea(this,uVar6 + iVar8,shrunkAreaEnd);
          uVar2 = pJVar3->granularity;
          span->_size = (uVar9 & 0xffffffff) * (ulong)uVar2;
        }
        EVar10 = 0;
        if ((newSize < uVar5 * uVar7) && (((impl->super_Impl).options & kFillUnusedMemory) != kNone)
           ) {
          mem = (void *)((ulong)((uVar6 + iVar8) * (uint)uVar2) + (long)(this->_mapping).rw);
          uVar9 = (ulong)((uVar7 - uVar6) * (uint)uVar2);
          if (alreadyUnderWriteScope) {
            JitAllocatorImpl_fillPattern(mem,(impl->super_Impl).fillPattern,uVar9);
            EVar10 = 0;
          }
          else {
            scope._policy = kNeverFlush;
            scope._rxPtr = mem;
            scope._size = uVar9;
            VirtMem::protectJitMemory(kReadWrite);
            JitAllocatorImpl_fillPattern(mem,(impl->super_Impl).fillPattern,uVar9);
            EVar10 = 0;
            VirtMem::ProtectJitReadWriteScope::~ProtectJitReadWriteScope(&scope);
          }
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&impl->lock);
  }
  return EVar10;
}

Assistant:

static Error JitAllocatorImpl_shrink(JitAllocatorPrivateImpl* impl, JitAllocator::Span& span, size_t newSize, bool alreadyUnderWriteScope) noexcept {
  JitAllocatorBlock* block = static_cast<JitAllocatorBlock*>(span._block);
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorInvalidArgument);

  LockGuard guard(impl->lock);

  // Offset relative to the start of the block.
  JitAllocatorPool* pool = block->pool();
  size_t offset = (size_t)((uint8_t*)span.rx() - block->rxPtr());

  // The first bit representing the allocated area and its size.
  uint32_t areaStart = uint32_t(offset >> pool->granularityLog2);

  // Don't trust `span.size()` - if it has been already truncated we would be off...
  bool isUsed = Support::bitVectorGetBit(block->_usedBitVector, areaStart);
  if (ASMJIT_UNLIKELY(!isUsed))
    return DebugUtils::errored(kErrorInvalidArgument);

  uint32_t areaEnd = uint32_t(Support::bitVectorIndexOf(block->_stopBitVector, areaStart, true)) + 1;
  uint32_t areaPrevSize = areaEnd - areaStart;
  uint32_t spanPrevSize = areaPrevSize * pool->granularity;
  uint32_t areaShrunkSize = pool->areaSizeFromByteSize(newSize);

  if (ASMJIT_UNLIKELY(areaShrunkSize > areaPrevSize))
    return DebugUtils::errored(kErrorInvalidArgument);

  uint32_t areaDiff = areaPrevSize - areaShrunkSize;
  if (areaDiff) {
    block->markShrunkArea(areaStart + areaShrunkSize, areaEnd);
    span._size = pool->byteSizeFromAreaSize(areaShrunkSize);
  }

  // Fill released memory if the secure mode is enabled.
  if (newSize < spanPrevSize && Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    uint8_t* spanPtr = block->rwPtr() + (areaStart + areaShrunkSize) * pool->granularity;
    size_t spanSize = areaDiff * pool->granularity;

    if (!alreadyUnderWriteScope) {
      VirtMem::ProtectJitReadWriteScope scope(spanPtr, spanSize, VirtMem::CachePolicy::kNeverFlush);
      JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
    }
    else {
      JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
    }
  }

  return kErrorOk;
}